

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool initialiseValueDistribution
               (string *distribution_name,string *value_name,double min_value_limit,
               double max_value_limit,double base_value_limit,
               HighsValueDistribution *value_distribution)

{
  reference pvVar1;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  HighsInt i;
  double log_base_value_limit;
  double log_ratio;
  HighsInt num_count;
  size_type in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  int local_64;
  int local_3c;
  bool local_1;
  
  std::__cxx11::string::operator=(in_RDX,in_RDI);
  std::__cxx11::string::operator=(in_RDX + 0x20,in_RSI);
  if (0.0 < in_XMM0_Qa) {
    if (in_XMM0_Qa <= in_XMM1_Qa) {
      if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
        if (in_XMM2_Qa <= 0.0) {
          return false;
        }
        dVar3 = log(in_XMM1_Qa / in_XMM0_Qa);
        dVar2 = log(in_XMM2_Qa);
        local_3c = (int)(dVar3 / dVar2 + 1.0);
      }
      else {
        local_3c = 1;
      }
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78,(value_type_conflict2 *)0x7f29d6);
      std::vector<double,_std::allocator<double>_>::assign
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 (value_type_conflict1 *)0x7f29f7);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x60),0);
      *pvVar1 = in_XMM0_Qa;
      for (local_64 = 1; local_64 < local_3c; local_64 = local_64 + 1) {
        dVar3 = in_XMM2_Qa;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x60),
                            (long)(local_64 + -1));
        dVar3 = dVar3 * *pvVar1;
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x60),
                            (long)local_64);
        *pvVar1 = dVar3;
      }
      *(int *)(in_RDX + 0x40) = local_3c;
      *(undefined4 *)(in_RDX + 0x44) = 0;
      *(undefined4 *)(in_RDX + 0x48) = 0;
      *(undefined8 *)(in_RDX + 0x50) = 0x7ff0000000000000;
      *(undefined8 *)(in_RDX + 0x58) = 0;
      *(undefined4 *)(in_RDX + 0x90) = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool initialiseValueDistribution(const std::string distribution_name,
                                 const std::string value_name,
                                 const double min_value_limit,
                                 const double max_value_limit,
                                 const double base_value_limit,
                                 HighsValueDistribution& value_distribution) {
  assert(min_value_limit > 0);
  assert(max_value_limit > 0);
  assert(base_value_limit > 1);
  value_distribution.distribution_name_ = distribution_name;
  value_distribution.value_name_ = value_name;
  if (min_value_limit <= 0) return false;
  if (max_value_limit < min_value_limit) return false;
  HighsInt num_count;
  if (min_value_limit == max_value_limit) {
    // For counting values below and above a value
    num_count = 1;
  } else {
    if (base_value_limit <= 0) return false;
    const double log_ratio = log(max_value_limit / min_value_limit);
    const double log_base_value_limit = log(base_value_limit);
    //    printf("initialiseValueDistribution: log_ratio = %g;
    //    log_base_value_limit = %g; log_ratio/log_base_value_limit = %g\n",
    //	   log_ratio, log_base_value_limit, log_ratio/log_base_value_limit);
    num_count = log_ratio / log_base_value_limit + 1;
  }
  //  printf("initialiseValueDistribution: num_count = %" HIGHSINT_FORMAT "\n",
  //  num_count);
  value_distribution.count_.assign(num_count + 1, 0);
  value_distribution.limit_.assign(num_count, 0);
  value_distribution.limit_[0] = min_value_limit;
  //  printf("Interval  0 is [%10.4g, %10.4g)\n", 0.0,
  //  value_distribution.limit_[0]);
  for (HighsInt i = 1; i < num_count; i++) {
    value_distribution.limit_[i] =
        base_value_limit * value_distribution.limit_[i - 1];
    //    printf("Interval %2" HIGHSINT_FORMAT " is [%10.4g, %10.4g)\n", i,
    //    value_distribution.limit_[i-1], value_distribution.limit_[i]);
  }
  //  printf("Interval %2" HIGHSINT_FORMAT " is [%10.4g, inf)\n", num_count,
  //  value_distribution.limit_[num_count-1]);
  value_distribution.num_count_ = num_count;
  value_distribution.num_zero_ = 0;
  value_distribution.num_one_ = 0;
  value_distribution.min_value_ = kHighsInf;
  value_distribution.max_value_ = 0;
  value_distribution.sum_count_ = 0;
  return true;
}